

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_astVariableDefinitionNode_primitiveEvaluate
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  _Bool _Var1;
  undefined1 auStack_88 [7];
  _Bool isMutable;
  sysbvm_stackFrameSourcePositionRecord_t sourcePositionRecord;
  sysbvm_stackFrameGCRootsRecord_t gcFrameRecord;
  sysbvm_astVariableDefinitionNode_t **variableDefinitionNode;
  anon_struct_16_2_f8ada542 gcFrame;
  sysbvm_tuple_t *environment;
  sysbvm_tuple_t *node;
  sysbvm_tuple_t *arguments_local;
  size_t argumentCount_local;
  sysbvm_tuple_t closure_local;
  sysbvm_context_t *context_local;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  gcFrame.value = (sysbvm_tuple_t)(arguments + 1);
  memset(&variableDefinitionNode,0,0x10);
  memset(&sourcePositionRecord.sourcePosition,0,0x20);
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord.sourcePosition);
  _auStack_88 = (sysbvm_stackFrameRecord_s *)0x0;
  sourcePositionRecord.previous._0_4_ = 6;
  sourcePositionRecord._8_8_ = *(undefined8 *)(*arguments + 0x10);
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)auStack_88);
  if (*(long *)(*arguments + 0x38) != 0) {
    gcFrame.type = sysbvm_interpreter_evaluateASTWithEnvironment
                             (context,*(sysbvm_tuple_t *)(*arguments + 0x38),
                              *(sysbvm_tuple_t *)gcFrame.value);
  }
  _Var1 = sysbvm_tuple_boolean_decode(*(sysbvm_tuple_t *)(*arguments + 0x50));
  if (_Var1) {
    gcFrame.type = sysbvm_referenceType_withBoxForValue
                             (context,*(sysbvm_tuple_t *)(*arguments + 0x20),gcFrame.type);
  }
  sysbvm_functionActivationEnvironment_setBindingActivationValue
            (context,*(sysbvm_tuple_t *)gcFrame.value,*(sysbvm_tuple_t *)(*arguments + 0x40),
             gcFrame.type,*(sysbvm_tuple_t *)(*arguments + 0x10));
  sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)auStack_88);
  sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord.sourcePosition);
  return gcFrame.type;
}

Assistant:

static sysbvm_tuple_t sysbvm_astVariableDefinitionNode_primitiveEvaluate(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_tuple_t *node = &arguments[0];
    sysbvm_tuple_t *environment = &arguments[1];

    struct {
        sysbvm_tuple_t type;
        sysbvm_tuple_t value;
    } gcFrame = {
        .value = SYSBVM_NULL_TUPLE
    };

    sysbvm_astVariableDefinitionNode_t **variableDefinitionNode = (sysbvm_astVariableDefinitionNode_t**)node;

    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);
    SYSBVM_STACKFRAME_PUSH_SOURCE_POSITION(sourcePositionRecord, (*variableDefinitionNode)->super.sourcePosition);

    if((*variableDefinitionNode)->valueExpression)
        gcFrame.value = sysbvm_interpreter_evaluateASTWithEnvironment(context, (*variableDefinitionNode)->valueExpression, *environment);

    bool isMutable = sysbvm_tuple_boolean_decode((*variableDefinitionNode)->isMutable);
    if(isMutable)
        gcFrame.value = sysbvm_referenceType_withBoxForValue(context, (*variableDefinitionNode)->super.analyzedType, gcFrame.value);

    sysbvm_functionActivationEnvironment_setBindingActivationValue(context, *environment, (*variableDefinitionNode)->binding, gcFrame.value, (*variableDefinitionNode)->super.sourcePosition);
    SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    return gcFrame.value;
}